

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ThreadState.cpp
# Opt level: O1

size_t __thiscall axl::spy::ThreadState::removeFrame(ThreadState *this,size_t frameBase)

{
  Ret *pRVar1;
  ulong uVar2;
  size_t sVar3;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
  it_00;
  size_t count;
  size_t sVar4;
  RbTreeIterator<unsigned_long,_axl::spy::ThreadState::Frame> it;
  Entry *local_30;
  HookCommonContext *local_28;
  size_t sStack_20;
  
  for (it_00.m_p = (this->m_frameMap).
                   super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                   .m_root; it_00.m_p != (Entry *)0x0;
      it_00.m_p = (&((it_00.m_p)->
                    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                    ).m_left)[uVar2 <= frameBase]) {
    uVar2 = ((it_00.m_p)->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_key;
    if (uVar2 == frameBase) goto LAB_0012bdf7;
  }
  it_00.m_p = (Entry *)0x0;
LAB_0012bdf7:
  if ((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
       )it_00.m_p ==
      (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
       )0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = ((it_00.m_p)->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value.m_ret.
            m_originalRet;
    local_30 = it_00.m_p;
    cleanup(this,(EVP_PKEY_CTX *)&local_30);
    sVar3 = ((it_00.m_p)->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value.m_chainedRetStack.
            super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
            .m_count;
    if (sVar3 == 0) {
      sl::
      BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
      ::erase(&(this->m_frameMap).
               super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
              ,(Iterator)it_00.m_p);
    }
    else {
      pRVar1 = ((it_00.m_p)->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value.
               m_chainedRetStack.
               super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
               .m_p + (sVar3 - 1);
      local_28 = pRVar1->m_context;
      sStack_20 = pRVar1->m_originalRet;
      count = 0;
      if (sVar3 != 0) {
        count = sVar3 - 1;
      }
      sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
      setCountImpl<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Construct>
                (&((it_00.m_p)->
                  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                  ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value.
                  m_chainedRetStack,count);
      (local_30->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value.m_ret.m_context =
           local_28;
      (local_30->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value.m_ret.m_originalRet =
           sStack_20;
    }
  }
  return sVar4;
}

Assistant:

size_t
ThreadState::removeFrame(size_t frameBase) {
	sl::RbTreeIterator<size_t, Frame> it = findFrame(frameBase);
	if (!it) {
		ASSERT(false && "protolesshooks: FATAL ERROR: return address not found");
		return 0;
	}

	size_t originalRet = it->m_value.m_ret.m_originalRet;
	cleanup(it);

	if (!it->m_value.m_chainedRetStack.isEmpty())
		it->m_value.m_ret = it->m_value.m_chainedRetStack.getBackAndPop();
	else
		m_frameMap.erase(it);

	return originalRet;
}